

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<char,fmt::v5::basic_format_specs<char>>::dec_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          int num_digits,string_view prefix,basic_format_specs<char> *spec,dec_writer f)

{
  alignment aVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  align_spec as;
  align_spec local_48;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::int_writer<char,_fmt::v5::basic_format_specs<char>_>::dec_writer>
  local_38;
  
  local_38.prefix.size_ = prefix.size_;
  local_38.prefix.data_ = prefix.data_;
  if (-1 < num_digits) {
    local_38.size_ = (uint)num_digits + local_38.prefix.size_;
    local_38.fill = (char_type)(spec->super_align_spec).fill_;
    aVar1 = (spec->super_align_spec).align_;
    if (aVar1 == ALIGN_NUMERIC) {
      uVar3 = (ulong)(spec->super_align_spec).width_;
      uVar4 = uVar3;
      if (uVar3 < local_38.size_) {
        uVar4 = local_38.size_;
      }
      local_38.padding = 0;
      if (local_38.size_ <= uVar3) {
        local_38.padding = uVar3 - local_38.size_;
      }
      local_48.align_ = (spec->super_align_spec).align_;
      local_48.width_ = (spec->super_align_spec).width_;
      local_48.fill_ = (spec->super_align_spec).fill_;
      local_38.size_ = uVar4;
    }
    else {
      uVar2 = (spec->super_core_format_specs).precision;
      if (num_digits < (int)uVar2) {
        if ((int)(uVar2 - num_digits) < 0) goto LAB_0015ec98;
        local_38.size_ = uVar2 + local_38.prefix.size_;
        local_38.padding = (size_t)(uVar2 - num_digits);
        local_38.fill = '0';
      }
      else {
        local_38.padding = 0;
      }
      local_48.align_ = (spec->super_align_spec).align_;
      local_48.width_ = (spec->super_align_spec).width_;
      local_48.fill_ = (spec->super_align_spec).fill_;
      if (aVar1 == ALIGN_DEFAULT) {
        local_48.align_ = ALIGN_RIGHT;
      }
    }
    local_38.f = f;
    write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<char,fmt::v5::basic_format_specs<char>>::dec_writer>>
              (this,&local_48,&local_38);
    return;
  }
LAB_0015ec98:
  __assert_fail("(value >= 0) && \"negative value\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/fmt/include/fmt/core.h"
                ,0xd1,
                "typename std::make_unsigned<Int>::type fmt::internal::to_unsigned(Int) [Int = int]"
               );
}

Assistant:

inline uint32_t clzll(uint64_t x) {
  unsigned long r = 0;
# ifdef _WIN64
  _BitScanReverse64(&r, x);
# else
  // Scan the high 32 bits.
  if (_BitScanReverse(&r, static_cast<uint32_t>(x >> 32)))
    return 63 - (r + 32);

  // Scan the low 32 bits.
  _BitScanReverse(&r, static_cast<uint32_t>(x));
# endif

  assert(x != 0);
  // Static analysis complains about using uninitialized data
  // "r", but the only way that can happen is if "x" is 0,
  // which the callers guarantee to not happen.
# pragma warning(suppress: 6102)
  return 63 - r;
}